

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_selectable_text(nk_context *ctx,char *str,int len,nk_flags align,int *value)

{
  nk_window *pnVar1;
  nk_panel *pnVar2;
  nk_context *local_78;
  undefined1 local_6c [8];
  nk_rect bounds;
  nk_widget_layout_states state;
  nk_style *style;
  nk_input *in;
  nk_panel *layout;
  nk_window *win;
  int *value_local;
  nk_flags align_local;
  int len_local;
  char *str_local;
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x50a4,
                  "int nk_selectable_text(struct nk_context *, const char *, int, nk_flags, int *)")
    ;
  }
  if (value == (int *)0x0) {
    __assert_fail("value",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x50a5,
                  "int nk_selectable_text(struct nk_context *, const char *, int, nk_flags, int *)")
    ;
  }
  if (ctx->current == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x50a6,
                  "int nk_selectable_text(struct nk_context *, const char *, int, nk_flags, int *)")
    ;
  }
  if (ctx->current->layout == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x50a7,
                  "int nk_selectable_text(struct nk_context *, const char *, int, nk_flags, int *)")
    ;
  }
  if ((((ctx == (nk_context *)0x0) || (ctx->current == (nk_window *)0x0)) ||
      (ctx->current->layout == (nk_panel *)0x0)) || (value == (int *)0x0)) {
    ctx_local._4_4_ = 0;
  }
  else {
    pnVar1 = ctx->current;
    pnVar2 = pnVar1->layout;
    register0x00000000 = &ctx->style;
    bounds.w = (float)nk_widget((nk_rect *)local_6c,ctx);
    if (bounds.w == 0.0) {
      ctx_local._4_4_ = 0;
    }
    else {
      if ((bounds.w == 2.8026e-45) || (local_78 = ctx, (pnVar2->flags & 0x1000) != 0)) {
        local_78 = (nk_context *)0x0;
      }
      ctx_local._4_4_ =
           nk_do_selectable(&ctx->last_widget_state,&pnVar1->buffer,_local_6c,str,len,align,value,
                            &stack0xffffffffffffffa8->selectable,&local_78->input,
                            stack0xffffffffffffffa8->font);
    }
  }
  return ctx_local._4_4_;
}

Assistant:

NK_API int
nk_selectable_text(struct nk_context *ctx, const char *str, int len,
    nk_flags align, int *value)
{
    struct nk_window *win;
    struct nk_panel *layout;
    const struct nk_input *in;
    const struct nk_style *style;

    enum nk_widget_layout_states state;
    struct nk_rect bounds;

    NK_ASSERT(ctx);
    NK_ASSERT(value);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout || !value)
        return 0;

    win = ctx->current;
    layout = win->layout;
    style = &ctx->style;

    state = nk_widget(&bounds, ctx);
    if (!state) return 0;
    in = (state == NK_WIDGET_ROM || layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;
    return nk_do_selectable(&ctx->last_widget_state, &win->buffer, bounds,
                str, len, align, value, &style->selectable, in, style->font);
}